

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

connectdata * conncache_find_first_connection(conncache *connc)

{
  undefined8 *puVar1;
  Curl_hash_element *pCVar2;
  Curl_hash_iterator iter;
  Curl_hash_iterator CStack_28;
  
  Curl_hash_start_iterate(&connc->hash,&CStack_28);
  do {
    pCVar2 = Curl_hash_next_element(&CStack_28);
    if (pCVar2 == (Curl_hash_element *)0x0) {
      return (connectdata *)0x0;
    }
    puVar1 = *(undefined8 **)((long)pCVar2->ptr + 0x10);
  } while (puVar1 == (undefined8 *)0x0);
  return (connectdata *)*puVar1;
}

Assistant:

static struct connectdata *
conncache_find_first_connection(struct conncache *connc)
{
  struct Curl_hash_iterator iter;
  struct Curl_hash_element *he;
  struct connectbundle *bundle;

  Curl_hash_start_iterate(&connc->hash, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    struct Curl_llist_element *curr;
    bundle = he->ptr;

    curr = bundle->conn_list.head;
    if(curr) {
      return curr->ptr;
    }

    he = Curl_hash_next_element(&iter);
  }

  return NULL;
}